

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOEffect.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::IOEffect::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,IOEffect *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KUINT8 local_221;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  StandardVariable::GetAsString_abi_cxx11_(&local_1c0,&this->super_StandardVariable);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Status:            ",0x13);
  ENUMS::GetEnumAsStringIOStatus_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)(byte)(this->super_StandardVariable).field_0xe,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Link Type:         ",0x13);
  ENUMS::GetEnumAsStringIOLinkType_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)(byte)(this->super_StandardVariable).field_0xf,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Effect:            ",0x13);
  ENUMS::GetEnumAsStringIOEffectType_abi_cxx11_(&local_220,(ENUMS *)(ulong)this->m_ui8Eff,Value_01);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Effect Duty Cycle: ",0x13);
  local_221 = this->m_ui8EffDtyCyc;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_221,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"%\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Effect Duration:   ",0x13);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Process:           ",0x13);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString IOEffect::GetAsString() const
{
    KStringStream ss;

    ss << StandardVariable::GetAsString()
       << "Status:            " << GetEnumAsStringIOStatus( m_ui8Status )    << "\n"
       << "Link Type:         " << GetEnumAsStringIOLinkType( m_ui8LnkTyp )  << "\n"
       << "Effect:            " << GetEnumAsStringIOEffectType( m_ui8Eff )   << "\n"
       << "Effect Duty Cycle: " << m_ui8EffDtyCyc                            << "%\n"
       << "Effect Duration:   " << m_ui16EffDur                              << " seconds\n"
       << "Process:           " << m_ui16Proc                                << "\n";

    return ss.str();
}